

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight_test.cpp
# Opt level: O0

void __thiscall HeavyLight_Queries_Test::TestBody(HeavyLight_Queries_Test *this)

{
  undefined4 local_20;
  undefined4 local_1c;
  int b;
  int a;
  int tests;
  int n;
  HeavyLight_Queries_Test *this_local;
  
  srand(1);
  reset(10);
  generateTree(10);
  initHLD(0,10);
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    for (local_20 = local_1c; local_20 < 10; local_20 = local_20 + 1) {
      query(local_1c,local_20);
    }
  }
  return;
}

Assistant:

TEST(HeavyLight, Queries) {
    srand(1);
    int n = 10;
    rep(tests, 0, 10) {
        reset(n);
        generateTree(n);
        initHLD(0, n);
        rep(a, 0, n) rep(b, a, n) {
            query(a, b);
        }
        break;
    }
}